

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O1

UBool __thiscall
icu_63::SimpleTimeZone::getNextTransition
          (SimpleTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  AnnualTimeZoneRule **ppAVar1;
  AnnualTimeZoneRule *pAVar2;
  UBool UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  AnnualTimeZoneRule **ppAVar8;
  UDate *pUVar9;
  AnnualTimeZoneRule **ppAVar10;
  UDate UVar11;
  UDate stdDate;
  UDate dstDate;
  UErrorCode status;
  double local_48;
  double local_40;
  UErrorCode local_34;
  
  if (this->useDaylight == '\0') {
    return '\0';
  }
  local_34 = U_ZERO_ERROR;
  checkTransitionRules(this,&local_34);
  if (local_34 < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar11 = TimeZoneTransition::getTime(this->firstTransition);
    if (base < UVar11) {
LAB_00207abd:
      TimeZoneTransition::operator=(result,this->firstTransition);
    }
    else if (inclusive != '\0') {
      if ((UVar11 == base) && (!NAN(UVar11) && !NAN(base))) goto LAB_00207abd;
    }
    ppAVar10 = &this->stdRule;
    ppAVar1 = &this->dstRule;
    pAVar2 = this->stdRule;
    uVar4 = TimeZoneRule::getRawOffset(&this->dstRule->super_TimeZoneRule);
    uVar5 = TimeZoneRule::getDSTSavings(&this->dstRule->super_TimeZoneRule);
    iVar6 = (*(pAVar2->super_TimeZoneRule).super_UObject._vptr_UObject[9])
                      (base,pAVar2,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)(int)inclusive,&local_48);
    pAVar2 = this->dstRule;
    uVar4 = TimeZoneRule::getRawOffset(&this->stdRule->super_TimeZoneRule);
    uVar5 = TimeZoneRule::getDSTSavings(&this->stdRule->super_TimeZoneRule);
    pUVar9 = &local_40;
    iVar7 = (*(pAVar2->super_TimeZoneRule).super_UObject._vptr_UObject[9])
                      (base,pAVar2,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)(int)inclusive,pUVar9);
    if (((char)iVar6 == '\0') || (((char)iVar7 != '\0' && (local_40 <= local_48)))) {
      if (((char)iVar7 == '\0') ||
         ((ppAVar8 = ppAVar1, (char)iVar6 != '\0' && (local_48 <= local_40)))) goto LAB_00207a90;
    }
    else {
      pUVar9 = &local_48;
      ppAVar8 = ppAVar10;
      ppAVar10 = ppAVar1;
    }
    TimeZoneTransition::setTime(result,*pUVar9);
    TimeZoneTransition::setFrom(result,&(*ppAVar10)->super_TimeZoneRule);
    TimeZoneTransition::setTo(result,&(*ppAVar8)->super_TimeZoneRule);
    UVar3 = '\x01';
  }
  else {
LAB_00207a90:
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UBool
SimpleTimeZone::getNextTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    if (!useDaylight) {
        return FALSE;
    }

    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    UDate firstTransitionTime = firstTransition->getTime();
    if (base < firstTransitionTime || (inclusive && base == firstTransitionTime)) {
        result = *firstTransition;
    }
    UDate stdDate, dstDate;
    UBool stdAvail = stdRule->getNextStart(base, dstRule->getRawOffset(), dstRule->getDSTSavings(), inclusive, stdDate);
    UBool dstAvail = dstRule->getNextStart(base, stdRule->getRawOffset(), stdRule->getDSTSavings(), inclusive, dstDate);
    if (stdAvail && (!dstAvail || stdDate < dstDate)) {
        result.setTime(stdDate);
        result.setFrom((const TimeZoneRule&)*dstRule);
        result.setTo((const TimeZoneRule&)*stdRule);
        return TRUE;
    }
    if (dstAvail && (!stdAvail || dstDate < stdDate)) {
        result.setTime(dstDate);
        result.setFrom((const TimeZoneRule&)*stdRule);
        result.setTo((const TimeZoneRule&)*dstRule);
        return TRUE;
    }
    return FALSE;
}